

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Mfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  Sfm_Par_t Pars;
  Sfm_Par_t local_a8;
  
  Sfm_ParSetDefault(&local_a8);
  local_a8.nTfoLevMax = 5;
  local_a8.nDepthMax = 100;
  local_a8.nWinSizeMax = 2000;
  Extra_UtilGetoptReset();
LAB_0029267a:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"WFDMLCNdaebvwh"), iVar3 = globalUtilOptind,
        0x60 < iVar1) {
    if (iVar1 - 0x61U < 5) {
      piVar5 = &local_a8.fRrOnly;
      switch(iVar1) {
      case 0x61:
        piVar5 = &local_a8.fArea;
        break;
      case 0x62:
        piVar5 = &local_a8.fAllBoxes;
        break;
      case 99:
        goto switchD_002926a7_caseD_63;
      case 0x65:
        piVar5 = &local_a8.fMoreEffort;
      }
    }
    else {
      piVar5 = &local_a8.fVerbose;
      if (iVar1 != 0x76) {
        if (iVar1 != 0x77) goto switchD_002926a7_caseD_63;
        piVar5 = &local_a8.fVeryVerbose;
      }
    }
    *(byte *)piVar5 = (byte)*piVar5 ^ 1;
  }
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00292853:
      Abc_Print(-1,pcVar6);
      goto switchD_002926a7_caseD_63;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a8.nBTLimit = uVar2;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-D\" should be followed by an integer.\n";
      goto LAB_00292853;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a8.nDepthMax = uVar2;
    break;
  case 0x45:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
    goto switchD_002926a7_caseD_63;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_00292853;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a8.nFanoutMax = uVar2;
    break;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_00292853;
    }
    local_a8.nGrowthLevel = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if (1000000000 < (uint)local_a8.nGrowthLevel) {
switchD_002926a7_caseD_63:
      Abc_Print(-2,"usage: &mfs [-WFDMLCN <num>] [-daebvwh]\n");
      Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
      Abc_Print(-2,"\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
                (ulong)(uint)local_a8.nTfoLevMax);
      Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
                (ulong)(uint)local_a8.nFanoutMax);
      Abc_Print(-2,"\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",
                (ulong)(uint)local_a8.nDepthMax);
      Abc_Print(-2,
                "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)local_a8.nWinSizeMax);
      Abc_Print(-2,
                "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
                ,(ulong)(uint)local_a8.nGrowthLevel);
      Abc_Print(-2,
                "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)local_a8.nBTLimit);
      Abc_Print(-2,"\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",
                (ulong)(uint)local_a8.nNodesMax);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_a8.fRrOnly == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle performing redundancy removal [default = %s]\n",pcVar6);
      pcVar6 = "area";
      if (local_a8.fArea == 0) {
        pcVar6 = "area+edges";
      }
      Abc_Print(-2,"\t-a       : toggle minimizing area or area+edges [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_a8.fMoreEffort == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-e       : toggle high-effort resubstitution [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_a8.fAllBoxes == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b       : toggle preserving all white boxes [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_a8.fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar6);
      if (local_a8.fVeryVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar7);
      pcVar6 = "\t-h       : print the command usage\n";
      iVar3 = -2;
LAB_00292a0b:
      Abc_Print(iVar3,pcVar6);
      return 1;
    }
    goto LAB_0029267a;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-M\" should be followed by an integer.\n";
      goto LAB_00292853;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a8.nWinSizeMax = uVar2;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_00292853;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a8.nNodesMax = uVar2;
    break;
  default:
    if (iVar1 != 0x57) {
      if (iVar1 == -1) {
        pGVar4 = pAbc->pGia;
        if (pGVar4 == (Gia_Man_t *)0x0) {
          pcVar6 = "Abc_CommandAbc9Mfs(): There is no AIG.\n";
        }
        else {
          if (pGVar4->nBufs != 0) {
            pcVar6 = "Abc_CommandAbc9Mfs(): This command does not work with barrier buffers.\n";
            iVar3 = -1;
            goto LAB_00292a0b;
          }
          if (pGVar4->vMapping == (Vec_Int_t *)0x0) {
            pcVar6 = "Abc_CommandAbc9Mfs(): The current AIG has no mapping.\n";
          }
          else {
            iVar3 = Gia_ManLutSizeMax(pGVar4);
            if (iVar3 < 0x10) {
              pGVar4 = Gia_ManPerformMfs(pAbc->pGia,&local_a8);
              Abc_FrameUpdateGia(pAbc,pGVar4);
              return 0;
            }
            pcVar6 = 
            "Abc_CommandAbc9Mfs(): The current mapping has nodes with more than 15 inputs. Cannot use \"mfs\".\n"
            ;
          }
        }
        Abc_Print(-1,pcVar6);
        return 0;
      }
      goto switchD_002926a7_caseD_63;
    }
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-W\" should be followed by an integer.\n";
      goto LAB_00292853;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_a8.nTfoLevMax = uVar2;
  }
  globalUtilOptind = iVar3 + 1;
  if ((int)uVar2 < 0) goto switchD_002926a7_caseD_63;
  goto LAB_0029267a;
}

Assistant:

int Abc_CommandAbc9Mfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManPerformMfs( Gia_Man_t * p, Sfm_Par_t * pPars );
    Gia_Man_t * pTemp; int c;
    Sfm_Par_t Pars, * pPars = &Pars;
    Sfm_ParSetDefault( pPars );
    pPars->nTfoLevMax  =    5;
    pPars->nDepthMax   =  100;
    pPars->nWinSizeMax = 2000;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WFDMLCNdaebvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinSizeMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < 0 || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodesMax < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fRrOnly ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'e':
            pPars->fMoreEffort ^= 1;
            break;
        case 'b':
            pPars->fAllBoxes ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): The current AIG has no mapping.\n" );
        return 0;
    }
    if ( Gia_ManLutSizeMax(pAbc->pGia) > 15 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): The current mapping has nodes with more than 15 inputs. Cannot use \"mfs\".\n" );
        return 0;
    }
/*
    if ( pAbc->pGia->pAigExtra && Gia_ManPiNum(pAbc->pGia->pAigExtra) > 6 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): The current white-boxes have more than 6 inputs. Cannot use \"mfs\".\n" );
        return 0;
    }
*/
    pTemp = Gia_ManPerformMfs( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &mfs [-WFDMLCN <num>] [-daebvwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",                   pPars->nDepthMax );
    Abc_Print( -2, "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n",    pPars->nWinSizeMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",                    pPars->nNodesMax );
    Abc_Print( -2, "\t-d       : toggle performing redundancy removal [default = %s]\n",                        pPars->fRrOnly? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggle minimizing area or area+edges [default = %s]\n",                        pPars->fArea? "area": "area+edges" );
    Abc_Print( -2, "\t-e       : toggle high-effort resubstitution [default = %s]\n",                           pPars->fMoreEffort? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggle preserving all white boxes [default = %s]\n",                           pPars->fAllBoxes? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}